

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O2

Ptr __thiscall
core::image::raw_to_byte_image(image *this,ConstPtr *image,uint16_t vmin,uint16_t vmax)

{
  ushort uVar1;
  element_type *peVar2;
  pointer puVar3;
  uint uVar4;
  invalid_argument *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  uint uVar6;
  Ptr PVar7;
  
  if ((image->super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr != (element_type *)0x0) {
    Image<unsigned_char>::create();
    peVar2 = (image->
             super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    TypedImageBase<unsigned_char>::allocate
              (*(TypedImageBase<unsigned_char> **)this,
               (peVar2->super_TypedImageBase<unsigned_short>).super_ImageBase.w,
               (peVar2->super_TypedImageBase<unsigned_short>).super_ImageBase.h,
               (peVar2->super_TypedImageBase<unsigned_short>).super_ImageBase.c);
    uVar4 = (uint)vmin;
    for (_Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        peVar2 = (image->
                 super___shared_ptr<const_core::Image<unsigned_short>,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,
        puVar3 = (peVar2->super_TypedImageBase<unsigned_short>).data.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start,
        (long)_Var5._M_pi <
        (long)(int)((ulong)((long)*(pointer *)
                                   ((long)&(peVar2->super_TypedImageBase<unsigned_short>).data.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data + 8) - (long)puVar3) >>
                   1);
        _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&(_Var5._M_pi)->_vptr__Sp_counted_base + 1)) {
      uVar1 = puVar3[(long)_Var5._M_pi];
      uVar6 = (uint)uVar1;
      if (uVar1 <= vmin) {
        uVar6 = uVar4;
      }
      if (vmax <= (ushort)uVar6) {
        uVar6 = (uint)vmax;
      }
      *(char *)((long)&(_Var5._M_pi)->_vptr__Sp_counted_base + *(long *)(*(long *)this + 0x18)) =
           (char)(int)((double)((int)(((double)(int)(uVar6 - uVar4) * 255.0) /
                                     (double)(int)(vmax - uVar4)) & 0xffff) + 0.5);
    }
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var5._M_pi;
    PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

ByteImage::Ptr
raw_to_byte_image (RawImage::ConstPtr image, uint16_t vmin, uint16_t vmax)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        uint16_t value = std::min(vmax, std::max(vmin, image->at(i)));
        value = 255.0 * static_cast<double>(value - vmin)
            / static_cast<double>(vmax - vmin);
        img->at(i) = static_cast<uint8_t>(value + 0.5);
    }
    return img;
}